

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractorValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)609>(Result *__return_storage_ptr__,Model *format)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *paVar1;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  interface_00;
  bool bVar2;
  int32 modelVersion;
  int iVar3;
  TypeCase TVar4;
  CoreML *pCVar5;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  FeatureDescription *this_00;
  FeatureType *this_01;
  ArrayFeatureExtractor *this_02;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_1b1;
  string local_1b0;
  string local_188;
  undefined4 local_160;
  undefined4 local_15c;
  uchar *local_158;
  size_type local_150;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_148;
  Result local_130;
  uchar *local_100;
  size_type local_f8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_f0;
  Result local_d8;
  undefined1 local_a8 [48];
  Result result;
  allocator local_41;
  string local_40;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_40._M_storage._M_storage = (uchar  [8])Specification::Model::description(format);
  bVar2 = Specification::Model::has_arrayfeatureextractor((Model *)interface);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Model not an array feature extractor.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return __return_storage_ptr__;
  }
  Result::Result((Result *)(local_a8 + 0x28));
  interface_00._M_storage = local_40._M_storage._M_storage;
  modelVersion = Specification::Model::specificationversion((Model *)interface);
  validateModelDescription
            ((Result *)local_a8,(ModelDescription *)interface_00._M_storage,modelVersion);
  Result::operator=((Result *)(local_a8 + 0x28),(Result *)local_a8);
  Result::~Result((Result *)local_a8);
  bVar2 = Result::good((Result *)(local_a8 + 0x28));
  if (bVar2) {
    pCVar5 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)local_40._M_storage._M_storage);
    local_130.m_message._M_storage._M_storage[4] = '\x05';
    local_130.m_message._M_storage._M_storage[5] = '\0';
    local_130.m_message._M_storage._M_storage[6] = '\0';
    local_130.m_message._M_storage._M_storage[7] = '\0';
    local_100 = local_130.m_message._M_storage._M_storage + 4;
    local_f8 = 1;
    paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
             (local_130.m_message._M_storage._M_storage + 3);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
    __l_00._M_len = local_f8;
    __l_00._M_array = (iterator)local_100;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_f0,__l_00,paVar1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_d8,pCVar5,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_f0,in_R8);
    Result::operator=((Result *)(local_a8 + 0x28),&local_d8);
    Result::~Result(&local_d8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_f0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
              ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
               (local_130.m_message._M_storage._M_storage + 3));
    bVar2 = Result::good((Result *)(local_a8 + 0x28));
    if (bVar2) {
      pCVar5 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)local_40._M_storage._M_storage);
      local_188._M_storage._M_storage[4] = '\x02';
      local_188._M_storage._M_storage[5] = '\0';
      local_188._M_storage._M_storage[6] = '\0';
      local_188._M_storage._M_storage[7] = '\0';
      local_160 = 1;
      local_15c = 5;
      local_158 = local_188._M_storage._M_storage + 4;
      local_150 = 3;
      paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
               (local_188._M_storage._M_storage + 3);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
      __l._M_len = local_150;
      __l._M_array = (iterator)local_158;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_148,__l,paVar1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_130,pCVar5,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_148,
                 in_R8);
      Result::operator=((Result *)(local_a8 + 0x28),&local_130);
      Result::~Result(&local_130);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_148);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 (local_188._M_storage._M_storage + 3));
      bVar2 = Result::good((Result *)(local_a8 + 0x28));
      if (bVar2) {
        this = Specification::ModelDescription::input
                         ((ModelDescription *)local_40._M_storage._M_storage);
        iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                          (this);
        if (iVar3 == 1) {
          this_00 = Specification::ModelDescription::output
                              ((ModelDescription *)local_40._M_storage._M_storage,0);
          this_01 = Specification::FeatureDescription::type(this_00);
          TVar4 = Specification::FeatureType::Type_case(this_01);
          if (TVar4 == kDoubleType) {
            this_02 = Specification::Model::arrayfeatureextractor((Model *)interface);
            iVar3 = Specification::ArrayFeatureExtractor::extractindex_size(this_02);
            if (iVar3 != 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1b0,
                         "If output type is Double in interface, exactly one extraction index must be specified."
                         ,&local_1b1);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
              goto LAB_0035f928;
            }
          }
          Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_188,"Exactly one input array column must be specified.",
                     (allocator *)(local_1b0._M_storage._M_storage + 7));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator((allocator<char> *)(local_1b0._M_storage._M_storage + 7))
          ;
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
  }
LAB_0035f928:
  local_d8.m_message._M_storage._M_storage[4] = '\x01';
  local_d8.m_message._M_storage._M_storage[5] = '\0';
  local_d8.m_message._M_storage._M_storage[6] = '\0';
  local_d8.m_message._M_storage._M_storage[7] = '\0';
  Result::~Result((Result *)(local_a8 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_arrayFeatureExtractor>(const Specification::Model& format) {
        const auto& interface = format.description();
        
            // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_arrayfeatureextractor()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an array feature extractor.");
        }
        

        Result result;
        
            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             1,
                                                             {Specification::FeatureType::kMultiArrayType
                                                             });
        if (!result.good()) {
            return result;
        }
        
            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1,
                                                             {Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kMultiArrayType});
        
        if (!result.good()) {
            return result;
        }
        
        if(interface.input().size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Exactly one input array column must be specified.");
        }
        
        if(interface.output(0).type().Type_case() == Specification::FeatureType::kDoubleType
           && format.arrayfeatureextractor().extractindex_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If output type is Double in interface, exactly one extraction index must be specified.");
        }
        
        
            // TODO: check that the index is valid given the length of the input array.
            // auto index = format.arrayfeatureextractor().inputindex();
        
        return result;
    }